

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O2

OBJ_DATA * get_obj_keeper(CHAR_DATA *ch,CHAR_DATA *keeper,char *argument)

{
  OBJ_DATA *pOVar1;
  bool bVar2;
  int iVar3;
  OBJ_DATA **ppOVar4;
  OBJ_DATA *obj;
  int iVar5;
  char arg [4608];
  char acStack_1238 [4616];
  
  iVar3 = number_argument(argument,acStack_1238);
  ppOVar4 = &keeper->carrying;
  iVar5 = 0;
  do {
    obj = *ppOVar4;
    if (obj == (OBJ_DATA *)0x0) {
      return (OBJ_DATA *)0x0;
    }
    if ((((obj->wear_loc == -1) && (bVar2 = can_see_obj(keeper,obj), bVar2)) &&
        (bVar2 = can_see_obj(ch,obj), bVar2)) && (bVar2 = is_name(acStack_1238,obj->name), bVar2)) {
      iVar5 = iVar5 + 1;
      if (iVar5 == iVar3) {
        return obj;
      }
      while (((pOVar1 = obj->next_content, pOVar1 != (OBJ_DATA *)0x0 &&
              (obj->pIndexData == pOVar1->pIndexData)) &&
             (bVar2 = str_cmp(obj->short_descr,pOVar1->short_descr), !bVar2))) {
        obj = obj->next_content;
      }
    }
    ppOVar4 = &obj->next_content;
  } while( true );
}

Assistant:

OBJ_DATA *get_obj_keeper(CHAR_DATA *ch, CHAR_DATA *keeper, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	OBJ_DATA *obj;

	int number = number_argument(argument, arg);
	int count = 0;

	for (obj = keeper->carrying; obj != nullptr; obj = obj->next_content)
	{
		if (obj->wear_loc == WEAR_NONE
			&& can_see_obj(keeper, obj)
			&& can_see_obj(ch, obj)
			&& is_name(arg, obj->name))
		{
			if (++count == number)
				return obj;

			/* skip other objects of the same name */
			while (obj->next_content != nullptr
				&& obj->pIndexData == obj->next_content->pIndexData
				&& !str_cmp(obj->short_descr, obj->next_content->short_descr))
			{
				obj = obj->next_content;
			}
		}
	}

	return nullptr;
}